

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex,MatrixLoadFlags matrixLoadFlag)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  uint uVar5;
  byte bVar6;
  undefined7 in_register_00000089;
  char *resultVar_00;
  UniformLayout *pUVar7;
  MatrixLoadFlags matrixLoadFlag_00;
  int local_14c;
  uint local_148;
  int local_144;
  int local_140;
  int blockLayoutNdx;
  UniformLayout *local_138;
  UniformLayout *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  string srcPrefix;
  string apiPrefix;
  string srcName;
  string blockInstanceName;
  string apiName;
  string instancePostfix;
  
  bVar6 = (byte)blockPointers ^ 1;
  uVar5 = (uint)bVar6 * 0x800 + 0x800;
  local_148 = (uint)bVar6 * 0x200 + 0x200;
  pUVar7 = (UniformLayout *)0x0;
  local_138 = (UniformLayout *)interface;
  while( true ) {
    if ((long)(int)((ulong)(*(long *)(resultVar + 0x20) - *(long *)(resultVar + 0x18)) >> 4) <=
        (long)pUVar7) break;
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (*(long *)(resultVar + 0x18) + (long)pUVar7 * 0x10);
    if ((*(uint *)((long)&__lhs[2].field_2 + 0xc) & local_148) != 0) {
      sVar2 = __lhs[1]._M_string_length;
      local_144 = *(int *)((long)&__lhs[2].field_2 + 8);
      local_140 = 1;
      if (0 < local_144) {
        local_140 = local_144;
      }
      if (sVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&apiPrefix,"",(allocator<char> *)&instancePostfix);
      }
      else {
        std::operator+(&apiPrefix,__lhs,".");
      }
      local_14c = 0;
      local_130 = pUVar7;
      local_128 = __lhs;
      while( true ) {
        pUVar7 = local_130;
        if (local_140 <= local_14c) break;
        if (local_144 < 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&instancePostfix,"",(allocator<char> *)&blockInstanceName);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcPrefix,"[",(allocator<char> *)&apiName);
          de::toString<int>(&srcName,&local_14c);
          std::operator+(&blockInstanceName,&srcPrefix,&srcName);
          std::operator+(&instancePostfix,&blockInstanceName,"]");
          std::__cxx11::string::~string((string *)&blockInstanceName);
          std::__cxx11::string::~string((string *)&srcName);
          std::__cxx11::string::~string((string *)&srcPrefix);
        }
        pbVar1 = local_128;
        std::operator+(&blockInstanceName,local_128,&instancePostfix);
        if (sVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srcPrefix,"",(allocator<char> *)&srcName);
        }
        else {
          std::operator+(&srcName,__lhs + 1,&instancePostfix);
          std::operator+(&srcPrefix,&srcName,".");
          std::__cxx11::string::~string((string *)&srcName);
        }
        blockLayoutNdx = UniformLayout::getBlockLayoutIndex(local_138,(int)pUVar7,local_14c);
        cVar4 = std::
                _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)layout,&blockLayoutNdx);
        p_Var3 = cVar4._M_node[1]._M_parent;
        for (resultVar_00 = pbVar1[2]._M_dataplus._M_p + 0x20;
            pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (resultVar_00 + -0x20),
            pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_128[2]._M_string_length; resultVar_00 = resultVar_00 + 0x40) {
          if ((*(uint *)(resultVar_00 + 0x18) & uVar5) == 0) {
            std::operator+(&srcName,&srcPrefix,pbVar1);
            matrixLoadFlag_00 = 0x667b25;
            std::operator+(&apiName,&apiPrefix,pbVar1);
            generateCompareSrc(src,resultVar_00,(VarType *)&srcName,&apiName,(string *)local_138,
                               local_130,(int)p_Var3,(void *)(ulong)uVar5,
                               (deUint32)CONCAT71(in_register_00000089,isVertex),matrixLoadFlag_00);
            std::__cxx11::string::~string((string *)&apiName);
            std::__cxx11::string::~string((string *)&srcName);
          }
        }
        std::__cxx11::string::~string((string *)&srcPrefix);
        std::__cxx11::string::~string((string *)&blockInstanceName);
        std::__cxx11::string::~string((string *)&instancePostfix);
        local_14c = local_14c + 1;
      }
      std::__cxx11::string::~string((string *)&apiPrefix);
    }
    pUVar7 = (UniformLayout *)
             ((long)&(pUVar7->blocks).
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src,
						 const char* resultVar,
						 const ShaderInterface& interface,
						 const UniformLayout& layout,
						 const std::map<int,
						 void*>& blockPointers,
						 bool isVertex,
						 MatrixLoadFlags matrixLoadFlag)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool			hasInstanceName	= block.hasInstanceName();
		bool			isArray			= block.isArray();
		int				numInstances	= isArray ? block.getArraySize() : 1;
		std::string		apiPrefix		= hasInstanceName ? block.getBlockName() + "." : std::string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string		instancePostfix		= isArray ? std::string("[") + de::toString(instanceNdx) + "]" : std::string("");
			std::string		blockInstanceName	= block.getBlockName() + instancePostfix;
			std::string		srcPrefix			= hasInstanceName ? block.getInstanceName() + instancePostfix + "." : std::string("");
			int				blockLayoutNdx		= layout.getBlockLayoutIndex(blockNdx, instanceNdx);
			void*			basePtr				= blockPointers.find(blockLayoutNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				std::string srcName = srcPrefix + uniform.getName();
				std::string apiName = apiPrefix + uniform.getName();
				generateCompareSrc(src, resultVar, uniform.getType(), srcName, apiName, layout, blockNdx, basePtr, unusedMask, matrixLoadFlag);
			}
		}
	}
}